

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::pwd(void)

{
  char *pcVar1;
  runtime_error *this;
  Path *in_RDI;
  allocator local_1059;
  string local_1058;
  string local_1038;
  char cwd [4096];
  
  pcVar1 = getcwd(cwd,0x1000);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_1058,cwd,&local_1059);
    filename_to_utf8(&local_1038,&local_1058);
    Path(in_RDI,&local_1038);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_1058,"Failed to retrieve current working directory.",&local_1059);
  std::runtime_error::runtime_error(this,(string *)&local_1058);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Path Path::pwd()
{
#if defined(_PATHIE_UNIX)
  char cwd[PATH_MAX];
  if (getcwd(cwd, PATH_MAX) != NULL)
    return Path(filename_to_utf8(cwd));
  else
    throw(std::runtime_error("Failed to retrieve current working directory."));
#elif defined(_WIN32)
  wchar_t cwd[MAX_PATH];
  if (GetCurrentDirectoryW(MAX_PATH, cwd) == 0)
    throw(std::runtime_error("Failed to retrieve current working directory."));
  else
    return Path(utf16_to_utf8(std::wstring(cwd)));
#else
#error Unsupported platform.
#endif
}